

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_parser.c
# Opt level: O1

uchar * yajl_render_error_string(yajl_handle hand,uchar *jsonText,size_t jsonTextLen,int verbose)

{
  ulong uVar1;
  yajl_malloc_func p_Var2;
  void *pvVar3;
  yajl_lex_error error;
  char *__s;
  size_t sVar4;
  size_t sVar5;
  uchar *__dest;
  uchar *__dest_00;
  uchar uVar6;
  ulong uVar7;
  char *__s_00;
  ulong uVar8;
  long lVar9;
  char text [72];
  uchar local_78 [72];
  
  uVar1 = hand->bytesConsumed;
  uVar6 = (hand->stateStack).stack[(hand->stateStack).used - 1];
  if (uVar6 == '\x03') {
    error = yajl_lex_get_error(hand->lexer);
    __s = yajl_lex_error_to_string(error);
    __s_00 = "lexical";
  }
  else if (uVar6 == '\x02') {
    __s = hand->parseError;
    __s_00 = "parse";
  }
  else {
    __s = (char *)0x0;
    __s_00 = "unknown";
  }
  sVar4 = strlen(__s_00);
  if (__s == (char *)0x0) {
    lVar9 = sVar4 + 6;
  }
  else {
    sVar5 = strlen(__s);
    lVar9 = sVar4 + sVar5 + 8;
  }
  __dest = (uchar *)(*(hand->alloc).malloc)((hand->alloc).ctx,lVar9 + 2);
  if (__dest == (uchar *)0x0) {
    __dest = (uchar *)0x0;
  }
  else {
    *__dest = '\0';
    strcat((char *)__dest,__s_00);
    sVar4 = strlen((char *)__dest);
    builtin_memcpy(__dest + sVar4," error",7);
    if (__s != (char *)0x0) {
      sVar4 = strlen((char *)__dest);
      (__dest + sVar4)[0] = ':';
      (__dest + sVar4)[1] = ' ';
      __dest[sVar4 + 2] = '\0';
      strcat((char *)__dest,__s);
    }
    sVar4 = strlen((char *)__dest);
    (__dest + sVar4)[0] = '\n';
    (__dest + sVar4)[1] = '\0';
    if (verbose != 0) {
      uVar8 = uVar1 - 0x1e;
      sVar4 = 10;
      if (uVar1 < 0x1e) {
        uVar8 = 0;
        sVar4 = 0x28 - uVar1;
      }
      uVar7 = uVar1 + 0x1e;
      if (jsonTextLen <= uVar1 + 0x1e) {
        uVar7 = jsonTextLen;
      }
      sVar5 = 0;
      if (sVar4 != 0) {
        memset(local_78,0x20,sVar4);
        sVar5 = sVar4;
      }
      if (uVar8 < uVar7) {
        lVar9 = 0;
        do {
          uVar6 = jsonText[lVar9 + uVar8];
          if ((uVar6 == '\r') || (uVar6 == '\n')) {
            uVar6 = ' ';
          }
          local_78[lVar9 + sVar4] = uVar6;
          lVar9 = lVar9 + 1;
        } while (uVar7 - uVar8 != lVar9);
        sVar5 = sVar4 + lVar9;
      }
      (local_78 + sVar5)[0] = '\n';
      (local_78 + sVar5)[1] = '\0';
      p_Var2 = (hand->alloc).malloc;
      pvVar3 = (hand->alloc).ctx;
      sVar4 = strlen((char *)__dest);
      sVar5 = strlen((char *)local_78);
      __dest_00 = (uchar *)(*p_Var2)(pvVar3,(size_t)sVar4 + (size_t)sVar5 + 0x2b);
      if (__dest_00 != (uchar *)0x0) {
        *__dest_00 = '\0';
        strcat((char *)__dest_00,(char *)__dest);
        strcat((char *)__dest_00,(char *)local_78);
        sVar4 = strlen((char *)__dest_00);
        builtin_memcpy(__dest_00 + sVar4,"                     (right here) ------^\n",0x2b);
      }
      (*(hand->alloc).free)((hand->alloc).ctx,__dest);
      __dest = __dest_00;
    }
  }
  return __dest;
}

Assistant:

unsigned char *
yajl_render_error_string(yajl_handle hand, const unsigned char * jsonText,
                         size_t jsonTextLen, int verbose)
{
    size_t offset = hand->bytesConsumed;
    unsigned char * str;
    const char * errorType = NULL;
    const char * errorText = NULL;
    char text[72];
    const char * arrow = "                     (right here) ------^\n";

    if (yajl_bs_current(hand->stateStack) == yajl_state_parse_error) {
        errorType = "parse";
        errorText = hand->parseError;
    } else if (yajl_bs_current(hand->stateStack) == yajl_state_lexical_error) {
        errorType = "lexical";
        errorText = yajl_lex_error_to_string(yajl_lex_get_error(hand->lexer));
    } else {
        errorType = "unknown";
    }

    {
        size_t memneeded = 0;
        memneeded += strlen(errorType);
        memneeded += strlen(" error");
        if (errorText != NULL) {
            memneeded += strlen(": ");
            memneeded += strlen(errorText);
        }
        str = (unsigned char *) YA_MALLOC(&(hand->alloc), memneeded + 2);
        if (!str) return NULL;
        str[0] = 0;
        strcat((char *) str, errorType);
        strcat((char *) str, " error");
        if (errorText != NULL) {
            strcat((char *) str, ": ");
            strcat((char *) str, errorText);
        }
        strcat((char *) str, "\n");
    }

    /* now we append as many spaces as needed to make sure the error
     * falls at char 41, if verbose was specified */
    if (verbose) {
        size_t start, end, i;
        size_t spacesNeeded;

        spacesNeeded = (offset < 30 ? 40 - offset : 10);
        start = (offset >= 30 ? offset - 30 : 0);
        end = (offset + 30 > jsonTextLen ? jsonTextLen : offset + 30);

        for (i=0;i<spacesNeeded;i++) text[i] = ' ';

        for (;start < end;start++, i++) {
            if (jsonText[start] != '\n' && jsonText[start] != '\r')
            {
                text[i] = jsonText[start];
            }
            else
            {
                text[i] = ' ';
            }
        }
        assert(i <= 71);
        text[i++] = '\n';
        text[i] = 0;
        {
            char * newStr = (char *)
                YA_MALLOC(&(hand->alloc), (unsigned int)(strlen((char *) str) +
                                                         strlen((char *) text) +
                                                         strlen(arrow) + 1));
            if (newStr) {
                newStr[0] = 0;
                strcat((char *) newStr, (char *) str);
                strcat((char *) newStr, text);
                strcat((char *) newStr, arrow);
            }
            YA_FREE(&(hand->alloc), str);
            str = (unsigned char *) newStr;
        }
    }
    return str;
}